

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int xmlHashUpdateInternal
              (xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,void *payload,
              xmlHashDeallocator dealloc,int update)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlHashEntry *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  bool bVar7;
  undefined4 uVar8;
  uint hashValue;
  int iVar9;
  xmlHashEntry *__src;
  xmlChar *name;
  xmlChar *__dest;
  uint uVar10;
  xmlHashEntry *pxVar11;
  uint uVar12;
  int found;
  size_t lengths [3];
  xmlChar *local_78;
  int local_6c;
  xmlChar *local_68;
  xmlChar *local_60;
  size_t local_58;
  long lStack_50;
  long local_48;
  void *local_38;
  
  local_58 = 0;
  lStack_50 = 0;
  local_48 = 0;
  local_6c = 0;
  if (key == (xmlChar *)0x0 || hash == (xmlHashTablePtr)0x0) {
    return -1;
  }
  local_38 = payload;
  hashValue = xmlHashValue(hash->randomSeed,key,key2,key3,&local_58);
  uVar10 = hash->size;
  local_68 = key3;
  local_60 = key2;
  if (uVar10 == 0) {
    __src = (xmlHashEntry *)0x0;
  }
  else {
    __src = xmlHashFindEntry(hash,key,key2,key3,hashValue,&local_6c);
  }
  if (local_6c != 0) {
    if (update == 0) {
      return 0;
    }
    if (dealloc != (xmlHashDeallocator)0x0) {
      (*dealloc)(__src->payload,__src->key);
    }
    __src->payload = local_38;
    return 0;
  }
  if (hash->nbElems + 1 <= (uVar10 & 0xfffffff8) - (uVar10 >> 3)) goto LAB_001301be;
  if (uVar10 == 0) {
    uVar10 = 8;
LAB_0013019c:
    iVar9 = xmlHashGrow(hash,uVar10);
    if (iVar9 != 0) goto LAB_001301af;
    uVar10 = hash->size - 1;
    __src = hash->table + (uVar10 & hashValue);
    bVar7 = true;
    if (__src->hashValue != 0) {
      uVar12 = 0;
      do {
        uVar1 = (uVar10 & hashValue) + 1 + uVar12;
        __src = __src + 1;
        if ((uVar1 & uVar10) == 0) {
          __src = hash->table;
        }
      } while ((__src->hashValue != 0) &&
              (uVar12 = uVar12 + 1, uVar12 <= (uVar1 - __src->hashValue & uVar10)));
    }
  }
  else {
    if (-1 < (int)uVar10) {
      uVar10 = uVar10 * 2;
      goto LAB_0013019c;
    }
LAB_001301af:
    bVar7 = false;
  }
  if (!bVar7) {
    return -1;
  }
LAB_001301be:
  pxVar4 = local_68;
  if (hash->dict == (xmlDictPtr)0x0) {
    local_78 = (xmlChar *)(*xmlMalloc)(local_58 + 1);
    if (local_78 == (xmlChar *)0x0) {
      return -1;
    }
    memcpy(local_78,key,local_58 + 1);
    if (local_60 == (xmlChar *)0x0) {
      name = (xmlChar *)0x0;
    }
    else {
      name = (xmlChar *)(*xmlMalloc)(lStack_50 + 1);
      if (name == (xmlChar *)0x0) {
        (*xmlFree)(local_78);
        return -1;
      }
      memcpy(name,local_60,lStack_50 + 1);
    }
    if (pxVar4 == (xmlChar *)0x0) {
      __dest = (xmlChar *)0x0;
    }
    else {
      __dest = (xmlChar *)(*xmlMalloc)(local_48 + 1);
      if (__dest == (xmlChar *)0x0) {
        (*xmlFree)(local_78);
        (*xmlFree)(name);
        return -1;
      }
      memcpy(__dest,pxVar4,local_48 + 1);
    }
  }
  else {
    iVar9 = xmlDictOwns(hash->dict,key);
    local_78 = key;
    if ((iVar9 == 0) && (local_78 = xmlDictLookup(hash->dict,key,-1), local_78 == (xmlChar *)0x0)) {
      return -1;
    }
    name = local_60;
    if (((local_60 != (xmlChar *)0x0) && (iVar9 = xmlDictOwns(hash->dict,local_60), iVar9 == 0)) &&
       (name = xmlDictLookup(hash->dict,name,-1), name == (xmlChar *)0x0)) {
      return -1;
    }
    __dest = pxVar4;
    if (((pxVar4 != (xmlChar *)0x0) && (iVar9 = xmlDictOwns(hash->dict,pxVar4), iVar9 == 0)) &&
       (__dest = xmlDictLookup(hash->dict,pxVar4,-1), __dest == (xmlChar *)0x0)) {
      return -1;
    }
  }
  if (__src->hashValue != 0) {
    pxVar3 = hash->table;
    pxVar2 = pxVar3 + hash->size;
    pxVar11 = __src;
    do {
      pxVar11 = pxVar11 + 1;
      if (pxVar2 <= pxVar11) {
        pxVar11 = pxVar3;
      }
    } while (pxVar11->hashValue != 0);
    if (pxVar11 < __src) {
      memmove(pxVar3 + 1,pxVar3,(long)pxVar11 - (long)pxVar3);
      pxVar11 = pxVar2 + -1;
      pxVar3 = hash->table;
      uVar8 = *(undefined4 *)&pxVar2[-1].field_0x4;
      pxVar4 = pxVar2[-1].key;
      pxVar5 = pxVar2[-1].key2;
      pxVar6 = pxVar2[-1].key3;
      pxVar3->hashValue = pxVar2[-1].hashValue;
      *(undefined4 *)&pxVar3->field_0x4 = uVar8;
      pxVar3->key = pxVar4;
      pxVar3->key2 = pxVar5;
      pxVar3->key3 = pxVar6;
      pxVar3->payload = pxVar2[-1].payload;
    }
    memmove(__src + 1,__src,(long)pxVar11 - (long)__src);
  }
  __src->key = local_78;
  __src->key2 = name;
  __src->key3 = __dest;
  __src->payload = local_38;
  __src->hashValue = hashValue | 0x80000000;
  hash->nbElems = hash->nbElems + 1;
  return 1;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static int
xmlHashUpdateInternal(xmlHashTablePtr hash, const xmlChar *key,
                      const xmlChar *key2, const xmlChar *key3,
                      void *payload, xmlHashDeallocator dealloc, int update) {
    xmlChar *copy, *copy2, *copy3;
    xmlHashEntry *entry = NULL;
    size_t lengths[3] = {0, 0, 0};
    unsigned hashValue;
    int found = 0;

    if ((hash == NULL) || (key == NULL))
        return(-1);

    /*
     * Check for an existing entry
     */
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, lengths);
    if (hash->size > 0)
        entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found) {
        if (update) {
            if (dealloc)
                dealloc(entry->payload, entry->key);
            entry->payload = payload;
        }

        return(0);
    }

    /*
     * Grow the hash table if needed
     */
    if (hash->nbElems + 1 > hash->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (hash->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            /* This guarantees that nbElems < INT_MAX */
            if (hash->size >= MAX_HASH_SIZE)
                return(-1);
            newSize = hash->size * 2;
        }
        if (xmlHashGrow(hash, newSize) != 0)
            return(-1);

        /*
         * Find new entry
         */
        mask = hash->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &hash->table[pos];

        if (entry->hashValue != 0) {
            do {
                displ++;
                pos++;
                entry++;
                if ((pos & mask) == 0)
                    entry = hash->table;
            } while ((entry->hashValue != 0) &&
                     ((pos - entry->hashValue) & mask) >= displ);
        }
    }

    /*
     * Copy keys
     */
    if (hash->dict != NULL) {
        if (xmlDictOwns(hash->dict, key)) {
            copy = (xmlChar *) key;
        } else {
            copy = (xmlChar *) xmlDictLookup(hash->dict, key, -1);
            if (copy == NULL)
                return(-1);
        }

        if ((key2 == NULL) || (xmlDictOwns(hash->dict, key2))) {
            copy2 = (xmlChar *) key2;
        } else {
            copy2 = (xmlChar *) xmlDictLookup(hash->dict, key2, -1);
            if (copy2 == NULL)
                return(-1);
        }
        if ((key3 == NULL) || (xmlDictOwns(hash->dict, key3))) {
            copy3 = (xmlChar *) key3;
        } else {
            copy3 = (xmlChar *) xmlDictLookup(hash->dict, key3, -1);
            if (copy3 == NULL)
                return(-1);
        }
    } else {
        copy = xmlMalloc(lengths[0] + 1);
        if (copy == NULL)
            return(-1);
        memcpy(copy, key, lengths[0] + 1);

        if (key2 != NULL) {
            copy2 = xmlMalloc(lengths[1] + 1);
            if (copy2 == NULL) {
                xmlFree(copy);
                return(-1);
            }
            memcpy(copy2, key2, lengths[1] + 1);
        } else {
            copy2 = NULL;
        }

        if (key3 != NULL) {
            copy3 = xmlMalloc(lengths[2] + 1);
            if (copy3 == NULL) {
                xmlFree(copy);
                xmlFree(copy2);
                return(-1);
            }
            memcpy(copy3, key3, lengths[2] + 1);
        } else {
            copy3 = NULL;
        }
    }

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = hash->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&hash->table[1], hash->table,
                    (char *) cur - (char *) hash->table);
            cur = end - 1;
            hash->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->key = copy;
    entry->key2 = copy2;
    entry->key3 = copy3;
    entry->payload = payload;
    /* OR with MAX_HASH_SIZE to make sure that the value is non-zero */
    entry->hashValue = hashValue | MAX_HASH_SIZE;

    hash->nbElems++;

    return(1);
}